

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O3

cmCMakePath * __thiscall cmCMakePath::ReplaceWideExtension(cmCMakePath *this,cmCMakePath *extension)

{
  pointer pcVar1;
  cmCMakePath *pcVar2;
  string_view extension_00;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  pcVar1 = (extension->Path)._M_pathname._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,pcVar1,pcVar1 + (extension->Path)._M_pathname._M_string_length);
  extension_00._M_str = (char *)local_38;
  extension_00._M_len = local_30;
  pcVar2 = ReplaceWideExtension(this,extension_00);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return pcVar2;
}

Assistant:

cmCMakePath& ReplaceWideExtension(
    const cmCMakePath& extension = cmCMakePath())
  {
    return this->ReplaceWideExtension(
      static_cast<cm::string_view>(extension.Path.string()));
  }